

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O0

char * amqp_constant_name(int constantNumber)

{
  int constantNumber_local;
  char *local_8;
  
  if (constantNumber == 1) {
    local_8 = "AMQP_FRAME_METHOD";
  }
  else if (constantNumber == 2) {
    local_8 = "AMQP_FRAME_HEADER";
  }
  else if (constantNumber == 3) {
    local_8 = "AMQP_FRAME_BODY";
  }
  else if (constantNumber == 8) {
    local_8 = "AMQP_FRAME_HEARTBEAT";
  }
  else if (constantNumber == 200) {
    local_8 = "AMQP_REPLY_SUCCESS";
  }
  else if (constantNumber == 0xce) {
    local_8 = "AMQP_FRAME_END";
  }
  else if (constantNumber == 0x137) {
    local_8 = "AMQP_CONTENT_TOO_LARGE";
  }
  else if (constantNumber == 0x138) {
    local_8 = "AMQP_NO_ROUTE";
  }
  else if (constantNumber == 0x139) {
    local_8 = "AMQP_NO_CONSUMERS";
  }
  else if (constantNumber == 0x140) {
    local_8 = "AMQP_CONNECTION_FORCED";
  }
  else if (constantNumber == 0x192) {
    local_8 = "AMQP_INVALID_PATH";
  }
  else if (constantNumber == 0x193) {
    local_8 = "AMQP_ACCESS_REFUSED";
  }
  else if (constantNumber == 0x194) {
    local_8 = "AMQP_NOT_FOUND";
  }
  else if (constantNumber == 0x195) {
    local_8 = "AMQP_RESOURCE_LOCKED";
  }
  else if (constantNumber == 0x196) {
    local_8 = "AMQP_PRECONDITION_FAILED";
  }
  else if (constantNumber == 0x1f5) {
    local_8 = "AMQP_FRAME_ERROR";
  }
  else if (constantNumber == 0x1f6) {
    local_8 = "AMQP_SYNTAX_ERROR";
  }
  else if (constantNumber == 0x1f7) {
    local_8 = "AMQP_COMMAND_INVALID";
  }
  else if (constantNumber == 0x1f8) {
    local_8 = "AMQP_CHANNEL_ERROR";
  }
  else if (constantNumber == 0x1f9) {
    local_8 = "AMQP_UNEXPECTED_FRAME";
  }
  else if (constantNumber == 0x1fa) {
    local_8 = "AMQP_RESOURCE_ERROR";
  }
  else if (constantNumber == 0x212) {
    local_8 = "AMQP_NOT_ALLOWED";
  }
  else if (constantNumber == 0x21c) {
    local_8 = "AMQP_NOT_IMPLEMENTED";
  }
  else if (constantNumber == 0x21d) {
    local_8 = "AMQP_INTERNAL_ERROR";
  }
  else if (constantNumber == 0x1000) {
    local_8 = "AMQP_FRAME_MIN_SIZE";
  }
  else {
    local_8 = "(unknown)";
  }
  return local_8;
}

Assistant:

char const *amqp_constant_name(int constantNumber) {
  switch (constantNumber) {
    case AMQP_FRAME_METHOD:
      return "AMQP_FRAME_METHOD";
    case AMQP_FRAME_HEADER:
      return "AMQP_FRAME_HEADER";
    case AMQP_FRAME_BODY:
      return "AMQP_FRAME_BODY";
    case AMQP_FRAME_HEARTBEAT:
      return "AMQP_FRAME_HEARTBEAT";
    case AMQP_FRAME_MIN_SIZE:
      return "AMQP_FRAME_MIN_SIZE";
    case AMQP_FRAME_END:
      return "AMQP_FRAME_END";
    case AMQP_REPLY_SUCCESS:
      return "AMQP_REPLY_SUCCESS";
    case AMQP_CONTENT_TOO_LARGE:
      return "AMQP_CONTENT_TOO_LARGE";
    case AMQP_NO_ROUTE:
      return "AMQP_NO_ROUTE";
    case AMQP_NO_CONSUMERS:
      return "AMQP_NO_CONSUMERS";
    case AMQP_ACCESS_REFUSED:
      return "AMQP_ACCESS_REFUSED";
    case AMQP_NOT_FOUND:
      return "AMQP_NOT_FOUND";
    case AMQP_RESOURCE_LOCKED:
      return "AMQP_RESOURCE_LOCKED";
    case AMQP_PRECONDITION_FAILED:
      return "AMQP_PRECONDITION_FAILED";
    case AMQP_CONNECTION_FORCED:
      return "AMQP_CONNECTION_FORCED";
    case AMQP_INVALID_PATH:
      return "AMQP_INVALID_PATH";
    case AMQP_FRAME_ERROR:
      return "AMQP_FRAME_ERROR";
    case AMQP_SYNTAX_ERROR:
      return "AMQP_SYNTAX_ERROR";
    case AMQP_COMMAND_INVALID:
      return "AMQP_COMMAND_INVALID";
    case AMQP_CHANNEL_ERROR:
      return "AMQP_CHANNEL_ERROR";
    case AMQP_UNEXPECTED_FRAME:
      return "AMQP_UNEXPECTED_FRAME";
    case AMQP_RESOURCE_ERROR:
      return "AMQP_RESOURCE_ERROR";
    case AMQP_NOT_ALLOWED:
      return "AMQP_NOT_ALLOWED";
    case AMQP_NOT_IMPLEMENTED:
      return "AMQP_NOT_IMPLEMENTED";
    case AMQP_INTERNAL_ERROR:
      return "AMQP_INTERNAL_ERROR";
    default:
      return "(unknown)";
  }
}